

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

bool __thiscall OpenMD::RigidBody::getAtomRefCoor(RigidBody *this,Vector3d *coor,Atom *atom)

{
  Atom **ppAVar1;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var2;
  Vector3d *pVVar3;
  uint i;
  long lVar4;
  Atom *local_28;
  
  local_28 = atom;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                    ((this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_28);
  ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == ppAVar1) {
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",
             (ulong)(uint)(local_28->super_StuntDouble).globalIndex_,
             (ulong)(uint)(this->super_StuntDouble).globalIndex_);
    painCave.isFatal = 0;
    simError();
  }
  else {
    pVVar3 = (this->refCoords_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start +
             ((ulong)((long)_Var2._M_current -
                     (long)(this->atoms_).
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (pVVar3 != coor) {
      lVar4 = 0;
      do {
        (coor->super_Vector<double,_3U>).data_[lVar4] =
             (pVVar3->super_Vector<double,_3U>).data_[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
  }
  return _Var2._M_current != ppAVar1;
}

Assistant:

bool RigidBody::getAtomRefCoor(Vector3d& coor, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      // RigidBody class makes sure refCoords_ and atoms_ match each other
      coor = refCoords_[i - atoms_.begin()];
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }